

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_lite.cc
# Opt level: O1

bool google::protobuf::internal::MergePartialFromImpl<false>
               (ZeroCopyInputStream *input,MessageLite *msg)

{
  int iVar1;
  char *pcVar2;
  undefined4 extraout_var;
  EpsCopyInputStream local_80;
  undefined4 local_28;
  undefined4 local_24;
  undefined8 local_20;
  undefined8 uStack_18;
  
  local_80.zcis_ = (ZeroCopyInputStream *)0x0;
  local_80.buffer_[0] = '\0';
  local_80.buffer_[1] = '\0';
  local_80.buffer_[2] = '\0';
  local_80.buffer_[3] = '\0';
  local_80.buffer_[4] = '\0';
  local_80.buffer_[5] = '\0';
  local_80.buffer_[6] = '\0';
  local_80.buffer_[7] = '\0';
  local_80.buffer_[8] = '\0';
  local_80.buffer_[9] = '\0';
  local_80.buffer_[10] = '\0';
  local_80.buffer_[0xb] = '\0';
  local_80.buffer_[0xc] = '\0';
  local_80.buffer_[0xd] = '\0';
  local_80.buffer_[0xe] = '\0';
  local_80.buffer_[0xf] = '\0';
  local_80.buffer_[0x10] = '\0';
  local_80.buffer_[0x11] = '\0';
  local_80.buffer_[0x12] = '\0';
  local_80.buffer_[0x13] = '\0';
  local_80.buffer_[0x14] = '\0';
  local_80.buffer_[0x15] = '\0';
  local_80.buffer_[0x16] = '\0';
  local_80.buffer_[0x17] = '\0';
  local_80.buffer_[0x18] = '\0';
  local_80.buffer_[0x19] = '\0';
  local_80.buffer_[0x1a] = '\0';
  local_80.buffer_[0x1b] = '\0';
  local_80.buffer_[0x1c] = '\0';
  local_80.buffer_[0x1d] = '\0';
  local_80.buffer_[0x1e] = '\0';
  local_80.buffer_[0x1f] = '\0';
  local_80.aliasing_ = 0;
  local_80.last_tag_minus_1_ = 0;
  local_80.overall_limit_ = 0x7fffffff;
  local_28 = io::CodedInputStream::default_recursion_limit_;
  local_24 = 0x80000000;
  local_20 = 0;
  uStack_18 = 0;
  pcVar2 = EpsCopyInputStream::InitFrom(&local_80,input);
  iVar1 = (*msg->_vptr_MessageLite[0xd])(msg,pcVar2,&local_80);
  return local_80.last_tag_minus_1_ == 1 && CONCAT44(extraout_var,iVar1) != 0;
}

Assistant:

bool MergePartialFromImpl(io::ZeroCopyInputStream* input, MessageLite* msg) {
  const char* ptr;
  internal::ParseContext ctx(io::CodedInputStream::GetDefaultRecursionLimit(),
                             aliasing, &ptr, input);
  ptr = msg->_InternalParse(ptr, &ctx);
  // ctx has no explicit limit (hence we end on end of stream)
  return ptr && ctx.EndedAtEndOfStream();
}